

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_copy(mp_int *a,mp_int *b)

{
  mp_digit *pmVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint size;
  mp_digit *__s;
  
  if (a == b) {
    return 0;
  }
  size = a->used;
  if (b->alloc < (int)size) {
    iVar2 = mp_grow(b,size);
    if (iVar2 != 0) {
      return iVar2;
    }
    size = a->used;
  }
  __s = b->dp;
  if ((int)size < 1) {
    uVar3 = 0;
  }
  else {
    pmVar1 = a->dp;
    lVar4 = 0;
    do {
      *__s = pmVar1[lVar4];
      __s = __s + 1;
      lVar4 = lVar4 + 1;
      uVar3 = size;
    } while (size != (uint)lVar4);
  }
  if ((int)uVar3 < b->used) {
    memset(__s,0,(ulong)(b->used + ~uVar3) * 8 + 8);
  }
  b->used = size;
  b->sign = a->sign;
  return 0;
}

Assistant:

int mp_copy (mp_int * a, mp_int * b)
{
  int     res, n;

  /* if dst == src do nothing */
  if (a == b) {
    return MP_OKAY;
  }

  /* grow dest */
  if (b->alloc < a->used) {
     if ((res = mp_grow (b, a->used)) != MP_OKAY) {
        return res;
     }
  }

  /* zero b and copy the parameters over */
  {
    register mp_digit *tmpa, *tmpb;

    /* pointer aliases */

    /* source */
    tmpa = a->dp;

    /* destination */
    tmpb = b->dp;

    /* copy all the digits */
    for (n = 0; n < a->used; n++) {
      *tmpb++ = *tmpa++;
    }

    /* clear high digits */
    for (; n < b->used; n++) {
      *tmpb++ = 0;
    }
  }

  /* copy used count and sign */
  b->used = a->used;
  b->sign = a->sign;
  return MP_OKAY;
}